

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  int *in_RCX;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  int *in_R9;
  uint *in_stack_00000008;
  cpp_dec_float<200U,_int,_void> *in_stack_00000030;
  cpp_dec_float<200U,_int,_void> *in_stack_00000038;
  long in_stack_00000040;
  uint *in_stack_00000048;
  int *in_stack_00000050;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000140;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000348;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000350;
  int *in_stack_00000358;
  int *in_stack_00000360;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000368;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000370;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff6e8;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff6f0;
  cpp_dec_float<200U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff7e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff7f0;
  cpp_dec_float<200U,_int,_void> local_72c;
  cpp_dec_float<200U,_int,_void> local_6ac;
  undefined4 local_62c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffad0;
  int in_stack_fffffffffffffadc;
  int *in_stack_fffffffffffffae0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffae8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffaf0;
  int *local_320;
  uint local_308;
  int local_304;
  int in_stack_fffffffffffffe7c;
  
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  pcVar5 = in_stack_00000030;
  this_00 = in_stack_00000038;
  vSolveLright2(in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_00000358,
                in_stack_00000350,in_stack_00000348,_j,(int *)x.m_backend.data._M_elems._0_8_,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)x.m_backend.data._M_elems._8_8_);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
  lVar2 = *(long *)(in_RDI + 0x298);
  if (in_stack_00000040 == 0) {
    local_308 = 0;
    for (local_304 = 0; local_304 < (int)*in_stack_00000008; local_304 = local_304 + 1) {
      iVar1 = in_R9[local_304];
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
      if (bVar3) {
        enQueueMax(in_R9,(int *)&local_308,*(int *)(lVar2 + (long)iVar1 * 4));
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
    *in_stack_00000008 = local_308;
  }
  else {
    local_320 = in_stack_00000050;
    local_308 = 0;
    for (local_304 = 0; local_304 < (int)*in_stack_00000008; local_304 = local_304 + 1) {
      iVar1 = in_R9[local_304];
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
      if (bVar3) {
        *local_320 = iVar1;
        enQueueMax(in_R9,(int *)&local_308,*(int *)(lVar2 + (long)iVar1 * 4));
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,pcVar5);
        local_320 = local_320 + 1;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
    *in_stack_00000008 = local_308;
    *in_stack_00000048 = local_308;
  }
  local_308 = 0;
  for (local_304 = 0; local_304 < (int)(in_stack_00000038->data)._M_elems[0];
      local_304 = local_304 + 1) {
    uVar4 = (in_stack_00000030->data)._M_elems[local_304];
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,pcVar5);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    if (bVar3) {
      enQueueMax((int *)in_stack_00000030,(int *)&local_308,*(int *)(lVar2 + (long)(int)uVar4 * 4));
    }
    else {
      local_62c = 0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (this_00,(long_long_type)pcVar5);
    }
  }
  (in_stack_00000038->data)._M_elems[0] = local_308;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = &local_6ac;
  uVar4 = vSolveUright(in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_fffffffffffffe7c,in_stack_00000140)
  ;
  *in_stack_00000008 = uVar4;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = &local_72c;
  uVar4 = vSolveUright(in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_fffffffffffffe7c,in_stack_00000140)
  ;
  (in_stack_00000038->data)._M_elems[0] = uVar4;
  if (*(int *)(in_RDI + 0x2f8) == 0) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    uVar4 = vSolveUpdateRight(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                              in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                              in_stack_fffffffffffffad0);
    *in_stack_00000008 = uVar4;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    uVar4 = vSolveUpdateRight(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                              in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                              in_stack_fffffffffffffad0);
    (in_stack_00000038->data)._M_elems[0] = uVar4;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}